

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O2

void __thiscall Gecko::Subgraph::swap(Subgraph *this,uint k)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = this->perm[k];
  bVar2 = this->perm[k + 1];
  this->perm[k] = bVar2;
  this->perm[k + 1] = bVar1;
  this->node[bVar1] = this->node[bVar1] + (-1L << (bVar2 & 0x3f));
  this->node[bVar2] = this->node[bVar2] + (1L << (bVar1 & 0x3f));
  return;
}

Assistant:

void
Subgraph::swap(uint k)
{
  uint l = k + 1;
  Subnode::Index i = perm[k];
  Subnode::Index j = perm[l];
  perm[k] = j;
  perm[l] = i;
  node[i] -= ptrdiff_t(1) << j;
  node[j] += ptrdiff_t(1) << i;
}